

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O0

bool SocketClient::setFlags(int mFd,int flag,int getcmd,int setcmd,FlagMode mode)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  uint local_24;
  int e;
  int flg;
  FlagMode mode_local;
  int setcmd_local;
  int getcmd_local;
  int flag_local;
  int mFd_local;
  
  local_24 = 0;
  if (mode == FlagAppend) {
    do {
      local_24 = fcntl(mFd,getcmd,0);
      bVar3 = false;
      if (local_24 == 0xffffffff) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_24 == 0xffffffff) {
      return false;
    }
  }
  do {
    iVar1 = fcntl(mFd,setcmd,(ulong)(flag | local_24));
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  return iVar1 != -1;
}

Assistant:

bool SocketClient::setFlags(int mFd, int flag, int getcmd, int setcmd, FlagMode mode)
{
#ifdef _WIN32
    (void) mFd; (void) flag; (void) getcmd; (void) setcmd; (void) mode;  // unused
    return false;  // no fcntl() on windows
#else
    int flg = 0, e;
    if (mode == FlagAppend) {
        eintrwrap(e, ::fcntl(mFd, getcmd, 0));
        if (e == -1)
            return false;
        flg = e;
    }
    flg |= flag;
    eintrwrap(e, ::fcntl(mFd, setcmd, flg));
    return e != -1;
#endif
}